

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_expr.cpp
# Opt level: O2

double __thiscall
nivalis::Expr::newton
          (Expr *this,uint64_t var_addr,double x0,Environment *env,double eps_step,double eps_abs,
          int max_iter,double xmin,double xmax,Expr *deriv,double fx0,double dfx0)

{
  int iVar1;
  double dVar2;
  Expr deriv_expr;
  _Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> local_48;
  
  if (deriv == (Expr *)0x0) {
    diff((Expr *)&local_48,this,var_addr,env);
    dVar2 = newton(this,var_addr,x0,env,eps_step,eps_abs,max_iter,xmin,xmax,(Expr *)&local_48,fx0,
                   dfx0);
    std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    ~_Vector_base(&local_48);
  }
  else {
    iVar1 = 0;
    if (max_iter < 1) {
      max_iter = iVar1;
    }
    while (max_iter != iVar1) {
      if (iVar1 == 0) {
        if ((dfx0 == 1.79769313486232e+308) && (!NAN(dfx0))) {
          (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[var_addr] = x0;
          if ((fx0 == 1.79769313486232e+308) && (!NAN(fx0))) goto LAB_001d1845;
          goto LAB_001d185e;
        }
      }
      else {
        (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[var_addr] = x0;
LAB_001d1845:
        fx0 = operator()(this,env);
        if (NAN(fx0)) break;
LAB_001d185e:
        dfx0 = operator()(deriv,env);
        if (dfx0 == 0.0) break;
      }
      x0 = x0 - fx0 / dfx0;
      if ((ABS(fx0 / dfx0) < eps_step) && (ABS(fx0) < eps_abs)) {
        return x0;
      }
      if ((x0 < xmin) || (iVar1 = iVar1 + 1, xmax < x0)) break;
    }
    dVar2 = NAN;
  }
  return dVar2;
}

Assistant:

double Expr::newton(uint64_t var_addr, double x0, Environment& env,
        double eps_step, double eps_abs, int max_iter,
        double xmin, double xmax, const Expr* deriv,
        double fx0, double dfx0) const {
    if (deriv == nullptr) {
        Expr deriv_expr = diff(var_addr, env);
        return newton(var_addr, x0, env, eps_step,
                eps_abs, max_iter, xmin, xmax, &deriv_expr, fx0, dfx0);
    }
    NEWTON_PRINT("\n init@"); NEWTON_PRINT(x0);
    for (int i = 0; i < max_iter; ++i) {
        if (i || dfx0 == std::numeric_limits<double>::max()) {
            env.vars[var_addr] = x0;
            if (i || fx0 == std::numeric_limits<double>::max()) {
                fx0 = (*this)(env);
                if(std::isnan(fx0)) {
                    NEWTON_PRINT(" FAIL f=NAN");
                    return std::numeric_limits<double>::quiet_NaN(); // Fail
                }
            }
            dfx0 = (*deriv)(env);
            if(std::isnan(dfx0) || dfx0 == 0.) {
                NEWTON_PRINT(" FAIL d=NAN");
                return std::numeric_limits<double>::quiet_NaN(); // Fail
            }
        }
        double delta = fx0 / dfx0;
        x0 -= delta;
        NEWTON_PRINT(" "); NEWTON_PRINT(x0);
        if (std::fabs(delta) < eps_step && std::fabs(fx0) < eps_abs) {
            // Found root
            return x0;
        }
        if (x0 < xmin || x0 > xmax) {
            NEWTON_PRINT(" FAIL bounds");
            return std::numeric_limits<double>::quiet_NaN(); // Fail
        }
    }
    NEWTON_PRINT(" FAIL iter");
    return std::numeric_limits<double>::quiet_NaN(); // Fail
}